

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlParseJson.c
# Opt level: O2

JL_STATUS JlParseJsonEx(char *JsonString,_Bool IsJson5,JlDataObject **pRootObject,
                       size_t *pErrorAtPos)

{
  ParseStack *pPVar1;
  _Bool _Var2;
  char cVar3;
  bool bVar4;
  size_t sVar5;
  undefined8 uVar6;
  _Bool IsBareWord;
  JL_STATUS JVar7;
  int iVar8;
  JL_STATUS JVar9;
  ulong uVar10;
  size_t JsonStringLength;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  char **ppcVar14;
  byte bVar15;
  bool bVar16;
  byte bVar17;
  ulong uVar18;
  uint uVar19;
  ulong uVar20;
  char *pcVar21;
  ParseStack *pPVar22;
  bool bVar23;
  ulong uStackY_c0;
  char *local_a8;
  char *local_a0;
  JL_DATA_TYPE newType;
  char *processedString;
  size_t *local_88;
  ParseParameters local_80;
  uint local_4c;
  JlDataObject **local_48;
  char *local_40;
  JL_DATA_TYPE local_34;
  
  if (pRootObject == (JlDataObject **)0x0 || JsonString == (char *)0x0) {
    return JL_STATUS_INVALID_PARAMETER;
  }
  local_80._8_8_ = 0;
  local_80.JsonStringLength = 0;
  local_80.StringIndex = 0;
  local_80.IsJson5 = false;
  local_80._41_7_ = 0;
  local_80.JsonString = JsonString;
  local_80.JsonStringLength = strlen(JsonString);
  local_80.IsJson5 = IsJson5;
  local_80.Stack = (ParseStack *)WjTestLib_Calloc(0xa50,1);
  if (pErrorAtPos != (size_t *)0x0) {
    *pErrorAtPos = 0;
  }
  if (local_80.Stack == (ParseStack *)0x0) {
    JVar7 = JL_STATUS_OUT_OF_MEMORY;
    local_a0 = (char *)0x0;
    goto LAB_00103a0c;
  }
  local_80._8_8_ = local_80._8_8_ & 0xffffffff00000000;
  (local_80.Stack)->Type = JL_DATA_TYPE_NONE;
  (local_80.Stack)->ScanForSubObjects = true;
  local_4c = (uint)IsJson5;
  local_a0 = (char *)0x0;
  JVar7 = JL_STATUS_SUCCESS;
  uVar19 = 0;
  local_88 = pErrorAtPos;
  local_48 = pRootObject;
  local_40 = JsonString;
  while ((uVar6 = local_80._40_8_, sVar5 = local_80.StringIndex, pcVar21 = local_80.JsonString,
         pPVar22 = local_80.Stack, lVar11 = 4, -1 < (int)uVar19 && (JVar7 == JL_STATUS_SUCCESS))) {
    pPVar1 = local_80.Stack + uVar19;
    if (local_80.Stack[uVar19].FinishedProcessing != false) {
      JVar7 = JL_STATUS_SUCCESS;
      if (uVar19 != 0) {
        if (pPVar1[-1].Type == JL_DATA_TYPE_DICTIONARY) {
          JVar7 = JlAttachObjectToDictionaryObject
                            (pPVar1[-1].Object,pPVar1[-1].CurrentKeyName,pPVar1->Object);
          if ((local_88 != (size_t *)0x0) && (JVar7 != JL_STATUS_SUCCESS)) {
            *local_88 = pPVar1[-1].CurrentKeyStringIndex;
          }
          WjTestLib_Free(pPVar1[-1].CurrentKeyName);
          pPVar1[-1].CurrentKeyName = (char *)0x0;
        }
        else if (pPVar1[-1].Type == JL_DATA_TYPE_LIST) {
          JVar7 = JlAttachObjectToListObject(pPVar1[-1].Object,pPVar1->Object);
        }
      }
      local_80.StackIndex = uVar19 - 1;
      goto switchD_00102fa1_default;
    }
    local_a0 = (char *)local_80.StringIndex;
    if (pPVar1->ScanForSubObjects == true) {
      if (pPVar1->Type == JL_DATA_TYPE_NONE) {
        pPVar1->FinishedProcessing = true;
      }
      pPVar1->ScanForSubObjects = false;
      _newType = _newType & 0xffffffff00000000;
      JVar7 = DetectNewType(local_80.JsonString,local_80.JsonStringLength,local_80.StringIndex,
                            SUB41(local_4c,0),(size_t *)&processedString,&newType,local_88);
      if ((newType != JL_DATA_TYPE_NONE && JVar7 == JL_STATUS_SUCCESS) &&
         (JVar7 = JL_STATUS_JSON_NESTING_TOO_DEEP, uVar19 < 0x41)) {
        local_80.StringIndex = (size_t)processedString;
        local_80.StackIndex = uVar19 + 1;
        pPVar22 = pPVar22 + (uVar19 + 1);
        *(undefined8 *)pPVar22 = 0;
        pPVar22->Object = (JlDataObject *)0x0;
        pPVar22->FinishedProcessing = false;
        pPVar22->ProcessedFirstItem = false;
        pPVar22->ScanForSubObjects = false;
        pPVar22->PrevScanComma = false;
        pPVar22->DictionaryScanState = DICT_SCAN_STATE_NONE;
        pPVar22->CurrentKeyName = (char *)0x0;
        pPVar22->CurrentKeyStringIndex = 0;
        pPVar22->Type = newType;
        JVar7 = JlCreateObjectWithTag(newType,(size_t)processedString,&pPVar22->Object);
      }
      goto switchD_00102fa1_default;
    }
    _Var2 = local_80.IsJson5;
    JVar7 = JL_STATUS_SUCCESS;
    switch(pPVar1->Type) {
    case JL_DATA_TYPE_STRING:
      processedString = (char *)0x0;
      _newType = 0;
      if ((local_80.JsonStringLength - local_80.StringIndex < 4) ||
         (*(int *)(local_80.JsonString + local_80.StringIndex) != 0x6c6c756e)) {
        JVar7 = ParseString(local_80.JsonString + local_80.StringIndex,
                            local_80.JsonStringLength - local_80.StringIndex,false,local_80.IsJson5,
                            (size_t *)&newType,&processedString);
        pcVar21 = processedString;
        if (JVar7 == JL_STATUS_SUCCESS) {
          local_80.StringIndex = sVar5 + _newType;
          pPVar22[uVar19].FinishedProcessing = true;
          JVar7 = JlSetObjectString(pPVar22[uVar19].Object,processedString);
          WjTestLib_Free(pcVar21);
          if (JVar7 == JL_STATUS_SUCCESS) {
            JVar7 = JL_STATUS_SUCCESS;
            break;
          }
        }
        else if (_newType != 0 && local_88 != (size_t *)0x0) {
          *local_88 = (size_t)(sVar5 + _newType);
        }
        JlFreeObjectTree(&pPVar22[uVar19].Object);
        break;
      }
      local_80.Stack[uVar19].FinishedProcessing = true;
      local_80.StringIndex = local_80.StringIndex + 4;
      goto LAB_00103903;
    case JL_DATA_TYPE_NUMBER:
      local_a8 = (char *)(local_80.StringIndex + (long)local_80.JsonString);
      uVar20 = local_80.JsonStringLength - local_80.StringIndex;
      if (local_80.IsJson5 == true) {
        if (uVar20 < 4) {
          if (uVar20 == 3) {
            iVar8 = strncasecmp(local_a8,"inf",3);
            if (iVar8 == 0) {
              uStackY_c0 = 3;
              goto LAB_00103880;
            }
            iVar8 = strncasecmp(local_a8,"nan",3);
            uStackY_c0 = 3;
            goto LAB_00103368;
          }
          goto LAB_00103374;
        }
        iVar8 = strncasecmp(local_a8,"+inf",4);
        if (iVar8 == 0) {
          uStackY_c0 = 4;
LAB_00103880:
          JVar7 = JL_STATUS_SUCCESS;
          bVar23 = true;
          uVar10 = 0;
          bVar4 = false;
        }
        else {
          iVar8 = strncasecmp(local_a8,"-inf",4);
          uStackY_c0 = 4;
LAB_00103368:
          bVar23 = true;
          if (iVar8 != 0) goto LAB_00103374;
          JVar7 = JL_STATUS_SUCCESS;
          uVar10 = 0;
          bVar4 = false;
        }
      }
      else {
LAB_00103374:
        pcVar21 = (char *)(sVar5 + (long)pcVar21);
        JVar9 = JL_STATUS_SUCCESS;
        bVar4 = false;
        uVar10 = 0;
        for (uVar12 = 0; JVar7 = JL_STATUS_SUCCESS, uVar20 != uVar12; uVar12 = uVar12 + 1) {
          bVar15 = pcVar21[uVar12];
          bVar23 = bVar4;
          if (9 < (byte)(bVar15 - 0x30)) {
            uVar18 = (ulong)(bVar15 - 9);
            uVar13 = (uint)bVar15;
            JVar7 = JVar9;
            if (bVar15 - 9 < 0x3d) {
              if ((0x1000003400000000U >> (uVar18 & 0x3f) & 1) == 0) {
                if (uVar18 != 2) {
                  if ((0x800013UL >> (uVar18 & 0x3f) & 1) == 0) goto LAB_001033e8;
                  break;
                }
                JVar7 = JL_STATUS_SUCCESS;
                if (_Var2 != false) break;
LAB_0010348f:
                if (((!bVar4) || (0x25 < uVar13 - 0x41)) ||
                   (bVar23 = bVar4, (0x3f0000003fU >> ((ulong)(uVar13 - 0x41) & 0x3f) & 1) == 0)) {
                  JVar7 = JL_STATUS_INVALID_DATA;
                  break;
                }
              }
            }
            else {
LAB_001033e8:
              if (bVar15 != 0x65) {
                if (((((bVar15 == 0xc & _Var2) != 0) || (bVar15 == 0x2c)) || (bVar15 == 0x5d)) ||
                   (bVar15 == 0x7d)) break;
                if (bVar15 == 0xc2 && _Var2 == true) {
                  if (pcVar21[uVar12 + 1] == -0x60) break;
                }
                else {
                  if (_Var2 == false) goto LAB_0010348f;
                  if (uVar13 != 0xe2) {
                    if (uVar13 == 0xef) {
                      if ((pcVar21[uVar12 + 1] == -0x45) && (pcVar21[uVar12 + 2] == -0x41)) break;
                    }
                    else if (uVar13 == 0x2f) break;
                  }
                }
                if (((uVar12 != 1) || (*local_a8 != '0')) ||
                   (bVar23 = true, (byte)(local_a8[1] | 0x20U) != 0x78)) goto LAB_0010348f;
              }
            }
          }
          bVar4 = bVar23;
          uVar10 = uVar12;
        }
        bVar23 = false;
        uStackY_c0 = 0;
      }
      uVar20 = uVar6 & 0xff;
      JVar9 = JVar7;
      if (0x11 < uVar10) {
        JVar9 = JL_STATUS_INVALID_DATA;
      }
      if (uVar10 == 1) {
        JVar9 = JL_STATUS_INVALID_DATA;
      }
      if (!bVar4) {
        JVar9 = JVar7;
      }
      if ((JVar9 == JL_STATUS_SUCCESS && _Var2 == false) &&
         (JVar9 = JL_STATUS_SUCCESS, local_a8[uVar10] == '.')) {
        JVar9 = JL_STATUS_INVALID_DATA;
      }
      if (bVar23 || JVar9 != JL_STATUS_SUCCESS) {
        if (JVar9 == JL_STATUS_SUCCESS) goto LAB_001037c7;
      }
      else {
        uStackY_c0 = uVar10 + 1;
        bVar16 = true;
        bVar23 = false;
        bVar15 = 0;
        bVar17 = 0;
        uVar10 = uVar20;
        for (uVar12 = 0; uStackY_c0 != uVar12; uVar12 = uVar12 + 1) {
          if (bVar4) {
            if (((1 < uVar12) && (9 < (byte)(local_a8[uVar12] - 0x30U))) &&
               ((uVar13 = (byte)local_a8[uVar12] - 0x41, 0x25 < uVar13 ||
                ((0x3f0000003fU >> ((ulong)uVar13 & 0x3f) & 1) == 0)))) goto LAB_00103853;
          }
          else {
            cVar3 = local_a8[uVar12];
            if ((byte)(cVar3 - 0x30U) < 10) {
              uVar20 = (ulong)(byte)((bVar15 | bVar17) ^ 1 | (byte)uVar20);
              if (bVar17 == 0) {
                bVar23 = true;
              }
              bVar16 = false;
              uVar10 = 0;
            }
            else {
              if (cVar3 != '+') {
                if (cVar3 == 'e') {
LAB_0010375a:
                  if (bVar23) {
                    bVar16 = true;
                    bVar23 = false;
                    uVar10 = 1;
                    uVar20 = 0;
                    bVar17 = 1;
                    goto LAB_001037b7;
                  }
                }
                else if (cVar3 == '.') {
                  if ((uVar20 & 1) != 0) {
                    bVar15 = 1;
                    bVar23 = false;
                    uVar20 = 0;
                    goto LAB_001037b7;
                  }
                }
                else {
                  if (cVar3 == 'E') goto LAB_0010375a;
                  if ((cVar3 == '-') && (bVar16)) goto LAB_00103794;
                }
LAB_00103853:
                JVar9 = JL_STATUS_INVALID_DATA;
                goto LAB_00103857;
              }
              if ((uVar10 & 1) == 0) goto LAB_00103853;
LAB_00103794:
              uVar20 = (ulong)(byte)((byte)uVar20 | (bVar15 | bVar17) ^ 1);
              if (bVar17 == 0) {
                bVar23 = true;
              }
              bVar16 = false;
              uVar10 = 0;
            }
          }
LAB_001037b7:
        }
LAB_001037c7:
        if (_Var2 == false) {
          lVar11 = 0;
        }
        else {
          lVar11 = 1;
          if (*local_a8 == '+') {
            local_a8 = local_a8 + 1;
            uStackY_c0 = uStackY_c0 - 1;
          }
          else {
            lVar11 = 0;
          }
        }
        pcVar21 = (char *)WjTestLib_Calloc(uStackY_c0 + 1,1);
        JVar9 = JL_STATUS_OUT_OF_MEMORY;
        if (pcVar21 != (char *)0x0) {
          memcpy(pcVar21,local_a8,uStackY_c0);
          local_80.StringIndex = sVar5 + lVar11 + uStackY_c0;
          pPVar22[uVar19].FinishedProcessing = true;
          JVar9 = JlSetObjectNumberString(pPVar22[uVar19].Object,pcVar21);
          WjTestLib_Free(pcVar21);
          JVar7 = JL_STATUS_SUCCESS;
          if (JVar9 == JL_STATUS_SUCCESS) break;
        }
      }
LAB_00103857:
      JlFreeObjectTree(&pPVar22[uVar19].Object);
      JVar7 = JVar9;
      break;
    case JL_DATA_TYPE_BOOL:
      JVar9 = JL_STATUS_INVALID_DATA;
      if (3 < local_80.JsonStringLength - local_80.StringIndex) {
        bVar23 = *(int *)(local_80.JsonString + local_80.StringIndex) != 0x65757274;
        if (bVar23) {
          if (local_80.JsonStringLength - local_80.StringIndex != 4) {
            lVar11 = 5;
            iVar8 = bcmp(local_80.JsonString + local_80.StringIndex,"false",5);
            JVar9 = JL_STATUS_INVALID_DATA;
            if (iVar8 == 0) goto LAB_001031a5;
          }
        }
        else {
LAB_001031a5:
          local_80.StringIndex = sVar5 + lVar11;
          pPVar22[uVar19].FinishedProcessing = true;
          JVar9 = JlSetObjectBool(pPVar22[uVar19].Object,!bVar23);
          if (JVar9 == JL_STATUS_SUCCESS) break;
        }
      }
      JlFreeObjectTree(&pPVar22[uVar19].Object);
      JVar7 = JVar9;
      break;
    case JL_DATA_TYPE_LIST:
      _Var2 = pPVar1->ProcessedFirstItem;
      if (_Var2 == false) {
        local_80.StringIndex = local_80.StringIndex + 1;
      }
      JVar7 = SkipWhiteSpace(&local_80,(char *)&processedString);
      if (JVar7 == JL_STATUS_SUCCESS) {
        if (pPVar1->PrevScanComma == false) {
          if ((char)processedString == ',') {
            JVar7 = JL_STATUS_INVALID_DATA;
            if (_Var2 == false) goto LAB_001035ec;
            local_80.StringIndex = local_80.StringIndex + 1;
            pPVar1->PrevScanComma = true;
          }
          else if ((char)processedString == ']') {
LAB_0010351c:
            pPVar1->FinishedProcessing = true;
            local_80.StringIndex = local_80.StringIndex + 1;
          }
          else {
            JVar7 = JL_STATUS_INVALID_DATA;
            if (_Var2 != false) goto LAB_001035ec;
            pPVar1->ScanForSubObjects = true;
          }
LAB_001035e9:
          JVar7 = JL_STATUS_SUCCESS;
        }
        else {
          JVar7 = JL_STATUS_INVALID_DATA;
          if ((char)processedString != ',') {
            if ((char)processedString != ']') {
              pPVar1->ScanForSubObjects = true;
              pPVar1->PrevScanComma = false;
              goto LAB_001035e9;
            }
            JVar7 = JL_STATUS_INVALID_DATA;
            if (local_80.IsJson5 == true) goto LAB_0010351c;
          }
        }
LAB_001035ec:
        pPVar1->ProcessedFirstItem = true;
      }
      if ((JVar7 != JL_STATUS_SUCCESS && local_88 != (size_t *)0x0) && (*local_88 == 0)) {
        *local_88 = local_80.StringIndex;
      }
      break;
    case JL_DATA_TYPE_DICTIONARY:
      _Var2 = pPVar1->ProcessedFirstItem;
      if (_Var2 == false) {
        local_80.StringIndex = local_80.StringIndex + 1;
        pPVar1->DictionaryScanState = DICT_SCAN_STATE_NEED_KEY;
      }
      JVar7 = SkipWhiteSpace(&local_80,(char *)&newType);
      sVar5 = local_80.StringIndex;
      pPVar22 = local_80.Stack;
      if (JVar7 != JL_STATUS_SUCCESS) break;
      switch(pPVar1->DictionaryScanState) {
      case DICT_SCAN_STATE_NEED_KEY:
        if (((undefined1)newType == 0x22) || (((undefined1)newType == 0x27 & local_80.IsJson5) != 0)
           ) {
          IsBareWord = false;
        }
        else if ((local_80.IsJson5 == false) ||
                (((IsBareWord = true, (undefined1)newType != 0x24 && ((undefined1)newType != 0x5f))
                 && (0x19 < (byte)(((undefined1)newType & 0xdf) + 0xbf))))) {
          JVar7 = JL_STATUS_INVALID_DATA;
          if (((undefined1)newType == 0x7d) &&
             (JVar7 = JL_STATUS_INVALID_DATA, _Var2 != true || local_80.IsJson5 != false))
          goto LAB_001038f2;
          goto LAB_0010390b;
        }
        processedString = (char *)0x0;
        lVar11 = (long)local_80.StackIndex;
        JVar7 = ParseString(local_80.JsonString + local_80.StringIndex,
                            local_80.JsonStringLength - local_80.StringIndex,IsBareWord,false,
                            (size_t *)&processedString,&local_80.Stack[lVar11].CurrentKeyName);
        if (JVar7 != JL_STATUS_SUCCESS) {
          pPVar1->DictionaryScanState = DICT_SCAN_STATE_NEED_COLON;
LAB_0010390b:
          if (pPVar1->CurrentKeyName != (char *)0x0) {
            WjTestLib_Free(pPVar1->CurrentKeyName);
            pPVar1->CurrentKeyName = (char *)0x0;
          }
          pPVar1->ProcessedFirstItem = true;
          if ((local_88 != (size_t *)0x0) && (*local_88 == 0)) {
            *local_88 = local_80.StringIndex;
          }
          goto switchD_00102fa1_default;
        }
        pPVar22[lVar11].CurrentKeyStringIndex = sVar5;
        local_80.StringIndex = sVar5 + (long)processedString;
        pPVar1->DictionaryScanState = DICT_SCAN_STATE_NEED_COLON;
        break;
      case DICT_SCAN_STATE_NEED_COLON:
        JVar7 = JL_STATUS_INVALID_DATA;
        if ((undefined1)newType != 0x3a) goto LAB_0010390b;
        pPVar1->DictionaryScanState = DICT_SCAN_STATE_NEED_VALUE;
        pPVar1->ScanForSubObjects = true;
        goto LAB_001038fa;
      case DICT_SCAN_STATE_NEED_VALUE:
        pPVar1->DictionaryScanState = DICT_SCAN_STATE_NEED_COMMA_OR_END;
        pPVar1->ScanForSubObjects = false;
        break;
      case DICT_SCAN_STATE_NEED_COMMA_OR_END:
        if ((undefined1)newType == 0x7d) {
LAB_001038f2:
          pPVar1->FinishedProcessing = true;
          pPVar1->DictionaryScanState = DICT_SCAN_STATE_NONE;
        }
        else {
          JVar7 = JL_STATUS_INVALID_DATA;
          if ((undefined1)newType != 0x2c) goto LAB_0010390b;
          pPVar1->DictionaryScanState = DICT_SCAN_STATE_NEED_KEY;
        }
LAB_001038fa:
        local_80.StringIndex = local_80.StringIndex + 1;
      }
      pPVar1->ProcessedFirstItem = true;
LAB_00103903:
      JVar7 = JL_STATUS_SUCCESS;
    }
switchD_00102fa1_default:
    uVar19 = local_80.StackIndex;
  }
  if (JVar7 == JL_STATUS_SUCCESS) {
    pcVar21 = local_40 + local_80.StringIndex;
    JsonStringLength = strlen(pcVar21);
    JVar7 = JL_STATUS_SUCCESS;
    JVar9 = DetectNewType(pcVar21,JsonStringLength,0,SUB41(local_4c,0),(size_t *)&processedString,
                          &local_34,(size_t *)&newType);
    if (JVar9 == JL_STATUS_SUCCESS) {
      JVar7 = JL_STATUS_INVALID_DATA;
      if (local_88 != (size_t *)0x0) {
        *local_88 = sVar5;
      }
      uVar19 = 1;
      goto LAB_0010395c;
    }
    *local_48 = local_80.Stack[1].Object;
    pPVar22 = local_80.Stack;
  }
  else {
LAB_0010395c:
    pPVar22 = local_80.Stack;
    ppcVar14 = &local_80.Stack[uVar19].CurrentKeyName;
    for (; 0 < (int)uVar19; uVar19 = uVar19 - 1) {
      JlFreeObjectTree((JlDataObject **)(ppcVar14 + -2));
      if (*ppcVar14 != (char *)0x0) {
        WjTestLib_Free(*ppcVar14);
        *ppcVar14 = (char *)0x0;
      }
      ppcVar14 = ppcVar14 + -5;
    }
  }
  pErrorAtPos = local_88;
  WjTestLib_Free(pPVar22);
LAB_00103a0c:
  if (((pErrorAtPos != (size_t *)0x0) && (JVar7 != JL_STATUS_SUCCESS)) && (*pErrorAtPos == 0)) {
    *pErrorAtPos = (size_t)local_a0;
  }
  return JVar7;
}

Assistant:

JL_STATUS
    JlParseJsonEx
    (
        char const*     JsonString,
        bool            IsJson5,
        JlDataObject**  pRootObject,
        size_t*         pErrorAtPos
    )
{
    JL_STATUS jlStatus;

    if(     NULL != JsonString
        &&  NULL != pRootObject )
    {
        size_t prevStringIndex = 0;
        ParseParameters params = { 0 };
        params.JsonString = JsonString;
        params.JsonStringLength = strlen( JsonString );
        params.StringIndex = 0;
        params.IsJson5 = IsJson5;
        // Stack is allocated 2 more because we don't use the first element and we need an extra one to contain the last list
        // or dictionary nest levels items.
        params.Stack = JlAlloc( sizeof(ParseStack) * (MAX_JSON_DEPTH+2) );

        if( NULL != pErrorAtPos )
        {
            *pErrorAtPos = 0;
        }

        if( NULL != params.Stack )
        {
            // Setup first item in stack as the "none" type (for whitespace). When this is popped off we
            // will have finished.
            params.StackIndex = 0;
            params.Stack[0].Type = JL_DATA_TYPE_NONE;
            params.Stack[0].ScanForSubObjects = true;

            jlStatus = JL_STATUS_SUCCESS;
            while( params.StackIndex >= 0  &&  JL_STATUS_SUCCESS == jlStatus )
            {
                ParseStack* stackItem = &params.Stack[params.StackIndex];

                if( ! stackItem->FinishedProcessing )
                {
                    prevStringIndex = params.StringIndex;
                    if( params.Stack[params.StackIndex].ScanForSubObjects )
                    {
                        if( JL_DATA_TYPE_NONE == params.Stack[params.StackIndex].Type )
                        {
                            // Note we must mark it finished first because ParseForNewType will adjust StackIndex
                            stackItem->FinishedProcessing = true;
                            stackItem->ScanForSubObjects = false;
                        }
                        // Turn off scanning for sub objects as we will need to go back to list or dictionary
                        // processing between objects
                        stackItem->ScanForSubObjects = false;

                        jlStatus = ParseForNewType( &params, IsJson5, pErrorAtPos );
                    }
                    else if( JL_DATA_TYPE_STRING == stackItem->Type )
                    {
                        jlStatus = ParseForString( &params, pErrorAtPos );
                    }
                    else if( JL_DATA_TYPE_NUMBER == stackItem->Type )
                    {
                        jlStatus = ParseForNumber( &params );
                    }
                    else if( JL_DATA_TYPE_BOOL == stackItem->Type )
                    {
                        jlStatus = ParseForBool( &params );
                    }
                    else if( JL_DATA_TYPE_LIST == stackItem->Type )
                    {
                        jlStatus = ParseForList( &params, pErrorAtPos );
                    }
                    else if( JL_DATA_TYPE_DICTIONARY == stackItem->Type )
                    {
                        jlStatus = ParseForDictionary( &params, pErrorAtPos );
                    }

                }
                else
                {
                    // Attempt to attach this object to previous level (if its a list or dictionary)
                    jlStatus = AttachStackObjectToPreviousObject( params.Stack, params.StackIndex, pErrorAtPos );
                    // Finished with this level. So pop off the stack
                    params.StackIndex -= 1;
                }
            }

            if( JL_STATUS_SUCCESS == jlStatus )
            {
                // Verify that there is nothing but white space after the final object.
                jlStatus = VerifyOnlyTrailingWhiteSpace( JsonString + params.StringIndex, IsJson5 );
                if( JL_STATUS_SUCCESS != jlStatus )
                {
                    // At this point we have a full object tree created, but the params are now
                    // reset. So modify index so it will remove the full tree (at index 1)
                    params.StackIndex = 1;

                    if( NULL != pErrorAtPos )
                    {
                        *pErrorAtPos = params.StringIndex;
                    }
                }
            }

            if( JL_STATUS_SUCCESS == jlStatus )
            {
                // Get root object (in index position 1)
                *pRootObject = params.Stack[1].Object;
            }
            else
            {
                // Free object tree created so far
                for( int32_t i=params.StackIndex; i>0; i-- )
                {
                    (void) JlFreeObjectTree( &params.Stack[i].Object );
                    if( NULL != params.Stack[i].CurrentKeyName )
                    {
                        JlFree( params.Stack[i].CurrentKeyName );
                        params.Stack[i].CurrentKeyName = NULL;
                    }
                }
            }

            JlFree( params.Stack );
        }
        else
        {
            jlStatus = JL_STATUS_OUT_OF_MEMORY;
        }

        if( JL_STATUS_SUCCESS != jlStatus )
        {
            // If optional parameter was provided, then set the position of the error in the string.
            if(     NULL != pErrorAtPos
                &&  0 == *pErrorAtPos )
            {
                *pErrorAtPos = prevStringIndex;
            }
        }
    }
    else
    {
        jlStatus = JL_STATUS_INVALID_PARAMETER;
    }

    return jlStatus;
}